

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int fits_rdecomp(uchar *c,int clen,uint *array,int nx,int nblock)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  char *err_message;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar11 = 1;
  if (clen < 4) {
    err_message = "decompression error: input buffer not properly allocated";
  }
  else {
    uVar12 = *(uint *)c;
    uVar13 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    uVar12 = (uint)c[4];
    pbVar9 = c + 5;
    uVar15 = 0;
    iVar11 = 8;
    do {
      iVar5 = (int)uVar15;
      if (nx <= iVar5) {
        iVar11 = 0;
        if (c + (uint)clen <= pbVar9) {
          return 0;
        }
        err_message = "decompression warning: unused bytes at end of compressed buffer";
        goto LAB_001ff992;
      }
      if (iVar11 < 5) {
        iVar10 = iVar11 + -0xd;
        do {
          iVar11 = iVar10;
          bVar3 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          uVar12 = (uint)bVar3 | uVar12 << 8;
          iVar10 = iVar11 + 8;
        } while (iVar10 < -8);
        iVar11 = iVar11 + 0x10;
      }
      else {
        iVar11 = iVar11 + -5;
      }
      bVar3 = (byte)iVar11;
      uVar7 = uVar12 >> (bVar3 & 0x1f);
      uVar14 = ~(-1 << (bVar3 & 0x1f));
      uVar12 = uVar12 & uVar14;
      iVar10 = iVar5 + nblock;
      if (nx <= iVar5 + nblock) {
        iVar10 = nx;
      }
      iVar8 = uVar7 - 1;
      if (iVar8 < 0) {
        if (iVar5 < iVar10) {
          lVar6 = 0;
          do {
            array[iVar5 + lVar6] = uVar13;
            lVar6 = lVar6 + 1;
          } while ((long)iVar10 - (long)iVar5 != lVar6);
          uVar15 = (ulong)(uint)(iVar5 + (int)lVar6);
        }
      }
      else if (iVar8 == 0x19) {
        if (iVar5 < iVar10) {
          uVar15 = (ulong)iVar5;
          do {
            uVar7 = uVar12 << ((byte)(0x20 - iVar11) & 0x1f);
            iVar5 = 0x20 - iVar11;
            cVar4 = '\x18' - bVar3;
            if (iVar11 < 0x19) {
              do {
                iVar8 = iVar5;
                iVar5 = iVar8 + -8;
                bVar1 = *pbVar9;
                pbVar9 = pbVar9 + 1;
                uVar7 = uVar7 | (uint)bVar1 << ((byte)iVar5 & 0x1f);
              } while (7 < iVar5);
              cVar4 = (char)iVar8 + -0x10;
            }
            if (iVar11 == 0) {
              uVar12 = 0;
            }
            else {
              bVar1 = *pbVar9;
              pbVar9 = pbVar9 + 1;
              uVar7 = uVar7 | bVar1 >> (-cVar4 & 0x1fU);
              uVar12 = bVar1 & uVar14;
            }
            uVar13 = uVar13 + (-(uVar7 & 1) ^ uVar7 >> 1);
            array[uVar15] = uVar13;
            uVar15 = uVar15 + 1;
          } while (uVar15 != (long)iVar10);
        }
      }
      else if (iVar5 < iVar10) {
        uVar15 = (ulong)iVar5;
        do {
          while (uVar12 == 0) {
            iVar11 = iVar11 + 8;
            bVar3 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            uVar12 = (uint)bVar3;
          }
          uVar14 = iVar11 - nonzero_count[uVar12];
          uVar7 = ~uVar14 + iVar11;
          uVar12 = uVar12 ^ 1 << (uVar7 & 0x1f);
          iVar11 = uVar7 - iVar8;
          iVar5 = iVar11;
          if (iVar11 < 0) {
            do {
              bVar3 = *pbVar9;
              pbVar9 = pbVar9 + 1;
              uVar12 = uVar12 << 8 | (uint)bVar3;
              iVar11 = iVar5 + 8;
              bVar2 = iVar5 < -8;
              iVar5 = iVar11;
            } while (bVar2);
          }
          uVar7 = uVar12 >> ((byte)iVar11 & 0x1f) | uVar14 << ((byte)iVar8 & 0x1f);
          uVar12 = ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12;
          uVar13 = uVar13 + (-(uVar7 & 1) ^ uVar7 >> 1);
          array[uVar15] = uVar13;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (long)iVar10);
      }
    } while (pbVar9 <= c + (uint)clen);
    iVar11 = 1;
    err_message = "decompression error: hit end of compressed byte stream";
  }
LAB_001ff992:
  ffpmsg(err_message);
  return iVar11;
}

Assistant:

int fits_rdecomp (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned int array[],	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
/* int bsize;  */
int i, k, imax;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 4 bytes of input buffer contain the value of the first */
    /* 4 byte integer value, without any encoding */
    
    if (clen < 4)
    {
       ffpmsg("decompression error: input buffer not properly allocated");
       return 1;
    }
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<24);
    bytevalue = c[1];
    lastpix = lastpix | (bytevalue<<16);
    bytevalue = c[2];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[3];
    lastpix = lastpix | bytevalue;

    c += 4;  
    cend = c + clen - 4;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}